

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineNurbs.cpp
# Opt level: O3

void __thiscall
chrono::geometry::ChLineNurbs::SetupData
          (ChLineNurbs *this,int morder,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *mpoints,
          ChVectorDynamic<> *mknots,ChVectorDynamic<> *weights)

{
  ChVectorDynamic<> *pCVar1;
  double *pdVar2;
  double *pdVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  ChException *pCVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  Index size_1;
  Index size;
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if (morder < 1) {
    pCVar12 = (ChException *)__cxa_allocate_exception(0x28);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"ChLineNurbs::SetupData requires order >= 1.","");
    ChException::ChException(pCVar12,&local_50);
    __cxa_throw(pCVar12,&ChException::typeinfo,ChException::~ChException);
  }
  uVar11 = ((long)(mpoints->
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(mpoints->
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar11 < morder + 1) {
    pCVar12 = (ChException *)__cxa_allocate_exception(0x28);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,
               "ChLineNurbs::SetupData requires at least order+1 control points.","");
    ChException::ChException(pCVar12,&local_70);
    __cxa_throw(pCVar12,&ChException::typeinfo,ChException::~ChException);
  }
  if ((mknots != (ChVectorDynamic<> *)0x0) &&
     ((mknots->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      (morder + 1) + uVar11)) {
    pCVar12 = (ChException *)__cxa_allocate_exception(0x28);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"ChLineNurbs::SetupData: knots must have size=n_points+order+1",
               "");
    ChException::ChException(pCVar12,&local_90);
    __cxa_throw(pCVar12,&ChException::typeinfo,ChException::~ChException);
  }
  if ((weights != (ChVectorDynamic<> *)0x0) &&
     ((weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      uVar11)) {
    pCVar12 = (ChException *)__cxa_allocate_exception(0x28);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"ChLineNurbs::SetupData: weights must have size=n_points","");
    ChException::ChException(pCVar12,&local_b0);
    __cxa_throw(pCVar12,&ChException::typeinfo,ChException::~ChException);
  }
  this->p = morder;
  std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::operator=
            (&this->points,mpoints);
  iVar16 = (int)((long)(this->points).
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->points).
                       super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (mknots == (ChVectorDynamic<> *)0x0) {
    pCVar1 = &this->knots;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (long)(iVar16 + 1 + this->p));
    lVar14 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows;
    if (lVar14 < 0) goto LAB_007ffd4c;
    if (lVar14 != 0) {
      memset((pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data,0,lVar14 << 3);
    }
    ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(pCVar1,this->p,0.0,1.0);
  }
  else {
    pdVar2 = (mknots->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar11 = (mknots->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (((this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows != uVar11) &&
       (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&(this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                   uVar11,1),
       (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       != uVar11)) goto LAB_007ffe19;
    pdVar3 = (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    uVar13 = uVar11 + 7;
    if (-1 < (long)uVar11) {
      uVar13 = uVar11;
    }
    uVar13 = uVar13 & 0xfffffffffffffff8;
    if (7 < (long)uVar11) {
      lVar14 = 0;
      do {
        auVar17 = vmovdqa64_avx512f(*(undefined1 (*) [64])(pdVar2 + lVar14));
        auVar17 = vmovdqa64_avx512f(auVar17);
        *(undefined1 (*) [64])(pdVar3 + lVar14) = auVar17;
        lVar14 = lVar14 + 8;
      } while (lVar14 < (long)uVar13);
    }
    if ((long)uVar13 < (long)uVar11) {
      do {
        pdVar3[uVar13] = pdVar2[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  pCVar1 = &this->weights;
  if (weights == (ChVectorDynamic<> *)0x0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,(long)iVar16)
    ;
    lVar14 = (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows;
    if (lVar14 < 0) {
LAB_007ffd4c:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (lVar14 != 0) {
      auVar17 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
      auVar18 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pdVar2 = (pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data;
      auVar19 = vpbroadcastq_avx512f();
      lVar15 = 0;
      do {
        auVar20 = vpbroadcastq_avx512f();
        auVar20 = vporq_avx512f(auVar20,auVar18);
        uVar11 = vpcmpuq_avx512f(auVar20,auVar19,2);
        pdVar3 = pdVar2 + lVar15;
        bVar4 = (bool)((byte)uVar11 & 1);
        bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
        *pdVar3 = (double)((ulong)bVar4 * auVar17._0_8_ | (ulong)!bVar4 * (long)*pdVar3);
        pdVar3[1] = (double)((ulong)bVar5 * auVar17._8_8_ | (ulong)!bVar5 * (long)pdVar3[1]);
        pdVar3[2] = (double)((ulong)bVar6 * auVar17._16_8_ | (ulong)!bVar6 * (long)pdVar3[2]);
        pdVar3[3] = (double)((ulong)bVar7 * auVar17._24_8_ | (ulong)!bVar7 * (long)pdVar3[3]);
        pdVar3[4] = (double)((ulong)bVar8 * auVar17._32_8_ | (ulong)!bVar8 * (long)pdVar3[4]);
        pdVar3[5] = (double)((ulong)bVar9 * auVar17._40_8_ | (ulong)!bVar9 * (long)pdVar3[5]);
        pdVar3[6] = (double)((ulong)bVar10 * auVar17._48_8_ | (ulong)!bVar10 * (long)pdVar3[6]);
        pdVar3[7] = (double)((uVar11 >> 7) * auVar17._56_8_ |
                            (ulong)!SUB81(uVar11 >> 7,0) * (long)pdVar3[7]);
        lVar15 = lVar15 + 8;
      } while (((lVar14 + 0x1fffffffffffffffU & 0x1fffffffffffffff) + 8) -
               (ulong)((uint)(lVar14 + 0x1fffffffffffffffU) & 7) != lVar15);
    }
  }
  else {
    pdVar2 = (weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar11 = (weights->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_rows;
    if (((this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows != uVar11) &&
       (Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                  (&pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar11,1)
       , (this->weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_rows != uVar11)) {
LAB_007ffe19:
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                   );
    }
    pdVar3 = (pCVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar13 = uVar11 + 7;
    if (-1 < (long)uVar11) {
      uVar13 = uVar11;
    }
    uVar13 = uVar13 & 0xfffffffffffffff8;
    if (7 < (long)uVar11) {
      lVar14 = 0;
      do {
        auVar17 = vmovdqa64_avx512f(*(undefined1 (*) [64])(pdVar2 + lVar14));
        auVar17 = vmovdqa64_avx512f(auVar17);
        *(undefined1 (*) [64])(pdVar3 + lVar14) = auVar17;
        lVar14 = lVar14 + 8;
      } while (lVar14 < (long)uVar13);
    }
    if ((long)uVar13 < (long)uVar11) {
      do {
        pdVar3[uVar13] = pdVar2[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
  }
  return;
}

Assistant:

void ChLineNurbs::SetupData(
    int morder,                         ///< order p: 1= linear, 2=quadratic, etc.
    std::vector<ChVector<> >& mpoints,  ///< control points, size n. Required: at least n >= p+1
    ChVectorDynamic<>* mknots,          ///< knots, size k. Required k=n+p+1. If not provided, initialized to uniform.
    ChVectorDynamic<>* weights          ///< weights, size w. Required w=n. If not provided, all weights as 1.
) {
    if (morder < 1)
        throw ChException("ChLineNurbs::SetupData requires order >= 1.");

    if (mpoints.size() < morder + 1)
        throw ChException("ChLineNurbs::SetupData requires at least order+1 control points.");

    if (mknots && mknots->size() != (mpoints.size() + morder + 1))
        throw ChException("ChLineNurbs::SetupData: knots must have size=n_points+order+1");

    if (weights && weights->size() != mpoints.size())
        throw ChException("ChLineNurbs::SetupData: weights must have size=n_points");

    this->p = morder;
    this->points = mpoints;
    int n = (int)points.size();

    if (mknots)
        this->knots = *mknots;
    else {
        this->knots.setZero(n + p + 1);
        ChBasisToolsBspline::ComputeKnotUniformMultipleEnds(this->knots, p);
    }

    if (weights)
        this->weights = *weights;
    else
        this->weights.setConstant(n, 1.0);
}